

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O1

int CoreVfprintf(CPalThread *pthrCurrent,PAL_FILE *stream,char *format,__va_list_tag *aparg)

{
  LPCWSTR lpWideCharStr;
  uint uVar1;
  BOOL BVar2;
  INT IVar3;
  int iVar4;
  int iVar5;
  DWORD DVar6;
  CPalThread *pCVar7;
  WCHAR *pWVar8;
  uint *puVar9;
  byte *pbVar10;
  undefined8 *puVar11;
  size_t sVar12;
  short *psVar13;
  int *piVar14;
  ulong uVar15;
  CPalThread *pCVar16;
  undefined8 uVar17;
  int iVar18;
  uint uVar19;
  INT *pIVar20;
  INT *pIVar21;
  long in_FS_OFFSET;
  bool bVar22;
  _func_int **pp_Stack_4a8;
  CHAR TempBuffer [5];
  uint local_48c;
  int local_488;
  INT Prefix;
  INT Type;
  WCHAR local_476;
  uint local_474;
  WCHAR TempWChar;
  CPalThread *pCStack_470;
  INT Flags;
  LPCSTR Fmt;
  uint local_460;
  int local_45c;
  INT Precision;
  INT Width;
  va_list ap;
  CHAR local_438 [8];
  CHAR TempBuff [1024];
  
  TempBuff._1016_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  ap[0].overflow_arg_area = aparg->reg_save_area;
  _Precision = *(_func_int ***)aparg;
  ap[0]._0_8_ = aparg->overflow_arg_area;
  Fmt = (LPCSTR)&stream->PALferrorCode;
  iVar18 = 0;
  pIVar20 = (INT *)Fmt;
  _Type = stream;
  pCStack_470 = (CPalThread *)format;
LAB_0011c80c:
  while( true ) {
    if (*(char *)&pCStack_470->_vptr_CPalThread == '%') break;
    if (*(char *)&pCStack_470->_vptr_CPalThread == '\0') goto LAB_0011d17c;
LAB_0011c8c5:
    pCVar16 = pCStack_470;
    pthrCurrent = pCStack_470;
    pCStack_470 = (CPalThread *)((long)&pCStack_470->_vptr_CPalThread + 1);
    CorUnix::InternalFwrite(pCVar16,1,1,stream->bsdFilePtr,pIVar20);
    if (stream->PALferrorCode == 1) {
      iVar18 = -1;
      if (PAL_InitializeChakraCoreCalled != false) {
LAB_0011d17c:
        if (*(long *)(in_FS_OFFSET + 0x28) != TempBuff._1016_8_) {
          __stack_chk_fail();
        }
        return iVar18;
      }
      goto LAB_0011d085;
    }
    iVar18 = iVar18 + 1;
  }
  BVar2 = Internal_ExtractFormatA
                    (pthrCurrent,(LPCSTR *)&stack0xfffffffffffffb90,local_438,(LPINT)&local_474,
                     &local_45c,(LPINT)&local_460,(LPINT)&local_48c,&local_488);
  uVar17 = ap[0]._0_8_;
  iVar5 = local_45c;
  pIVar21 = (INT *)Fmt;
  uVar19 = local_474;
  iVar4 = local_488;
  uVar1 = local_48c;
  if (BVar2 == 0) goto LAB_0011c8c5;
  if (local_488 != 2 || (local_48c ^ 2) != 0) {
    pIVar20 = pIVar21;
    if ((local_48c ^ 2) == 0 && local_488 == 1) {
      if (local_45c + 3U < 2) {
        if ((uint)Precision < 0x29) {
          _Precision = (_func_int **)CONCAT44(Width,Precision + 8);
        }
        else {
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
      }
      if ((local_460 & 0xfffffffd) == 0xfffffffc) {
        if ((uint)Precision < 0x29) {
          _Precision = (_func_int **)CONCAT44(Width,Precision + 8);
        }
        else {
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
      }
      uVar15 = (ulong)_Precision & 0xffffffff;
      if (uVar15 < 0x29) {
        _Precision = (_func_int **)CONCAT44(Width,Precision + 8);
        pWVar8 = (WCHAR *)(uVar15 + (long)ap[0].overflow_arg_area);
      }
      else {
        pWVar8 = (WCHAR *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      local_476 = *pWVar8;
      pthrCurrent = (CPalThread *)0x0;
      iVar4 = WideCharToMultiByte(0,0,&local_476,1,(LPSTR)&pp_Stack_4a8,5,(LPCSTR)0x0,(LPBOOL)0x0);
      if (iVar4 == 0) {
        bVar22 = false;
        fprintf((FILE *)_stderr,"] %s %s:%d","CoreVfprintf",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                ,0x958);
        pthrCurrent = _stderr;
        DVar6 = GetLastError();
        stream = _Type;
        fprintf((FILE *)pthrCurrent,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar6);
      }
      else {
        TempBuffer[(long)iVar4 + -8] = '\0';
        IVar3 = Internal_AddPaddingVfprintf
                          (pthrCurrent,stream,(LPSTR)&pp_Stack_4a8,iVar5 - iVar4,local_474);
        if (IVar3 == -1) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011d085;
          bVar22 = false;
        }
        else {
          iVar18 = iVar18 + IVar3;
          bVar22 = true;
        }
      }
      bVar22 = !bVar22;
LAB_0011cd17:
      if (bVar22) goto LAB_0011d176;
    }
    else if (local_488 == 6) {
      if (local_45c == -2) {
        uVar15 = (ulong)_Precision & 0xffffffff;
        if (uVar15 < 0x29) {
          _Precision = (_func_int **)CONCAT44(Width,Precision + 8);
          piVar14 = (int *)(uVar15 + (long)ap[0].overflow_arg_area);
        }
        else {
          piVar14 = (int *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        local_45c = *piVar14;
      }
      if (local_460 == 0xfffffffe) {
        uVar15 = (ulong)_Precision & 0xffffffff;
        if (uVar15 < 0x29) {
          _Precision = (_func_int **)CONCAT44(Width,Precision + 8);
          puVar9 = (uint *)(uVar15 + (long)ap[0].overflow_arg_area);
        }
        else {
          puVar9 = (uint *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        local_460 = *puVar9;
      }
      if (local_48c == 1) {
        uVar15 = (ulong)_Precision & 0xffffffff;
        if (uVar15 < 0x29) {
          _Precision = (_func_int **)CONCAT44(Width,Precision + 8);
          puVar11 = (undefined8 *)(uVar15 + (long)ap[0].overflow_arg_area);
        }
        else {
          puVar11 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        *(short *)*puVar11 = (short)iVar18;
      }
      else {
        uVar15 = (ulong)_Precision & 0xffffffff;
        if (uVar15 < 0x29) {
          _Precision = (_func_int **)CONCAT44(Width,Precision + 8);
          puVar11 = (undefined8 *)(uVar15 + (long)ap[0].overflow_arg_area);
        }
        else {
          puVar11 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        *(int *)*puVar11 = iVar18;
      }
    }
    else if ((local_488 == 1) && ((local_474 & 4) != 0)) {
      uVar15 = (ulong)_Precision & 0xffffffff;
      if (uVar15 < 0x29) {
        _Precision = (_func_int **)CONCAT44(Width,Precision + 8);
        pbVar10 = (byte *)(uVar15 + (long)ap[0].overflow_arg_area);
      }
      else {
        pbVar10 = (byte *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      pp_Stack_4a8._0_2_ = (ushort)*pbVar10;
      IVar3 = Internal_AddPaddingVfprintf
                        (pthrCurrent,stream,(LPSTR)&pp_Stack_4a8,local_45c + -1,local_474);
      if (IVar3 == -1) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011d085;
      }
      else {
        iVar18 = iVar18 + IVar3;
      }
      if (IVar3 == -1) goto LAB_0011d176;
    }
    else {
      if ((local_488 == 2) && ((local_474 & 4) != 0)) {
        uVar15 = (ulong)_Precision & 0xffffffff;
        if (uVar15 < 0x29) {
          _Precision = (_func_int **)CONCAT44(Width,Precision + 8);
          puVar11 = (undefined8 *)(uVar15 + (long)ap[0].overflow_arg_area);
        }
        else {
          puVar11 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        pCVar16 = (CPalThread *)*puVar11;
        pthrCurrent = pCVar16;
        sVar12 = strlen((char *)pCVar16);
        IVar3 = Internal_AddPaddingVfprintf
                          (pthrCurrent,_Type,(LPSTR)pCVar16,local_45c - (int)sVar12,uVar19);
        if (IVar3 == -1) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011d085;
        }
        else {
          iVar18 = iVar18 + IVar3;
        }
        bVar22 = IVar3 == -1;
        stream = _Type;
        goto LAB_0011cd17;
      }
      if (local_488 == 5 && (local_48c ^ 1) == 0) {
        uVar15 = (ulong)_Precision & 0xffffffff;
        if (uVar15 < 0x29) {
          _Precision = (_func_int **)CONCAT44(Width,Precision + 8);
          psVar13 = (short *)(uVar15 + (long)ap[0].overflow_arg_area);
        }
        else {
          psVar13 = (short *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        pthrCurrent = (CPalThread *)stream->bsdFilePtr;
        iVar5 = fprintf((FILE *)pthrCurrent,local_438,(long)*psVar13);
      }
      else if ((local_48c ^ 1) == 0 && local_488 == 4) {
        uVar15 = (ulong)_Precision & 0xffffffff;
        if (uVar15 < 0x29) {
          _Precision = (_func_int **)CONCAT44(Width,Precision + 8);
          psVar13 = (short *)(uVar15 + (long)ap[0].overflow_arg_area);
        }
        else {
          psVar13 = (short *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        pthrCurrent = (CPalThread *)stream->bsdFilePtr;
        iVar5 = fprintf((FILE *)pthrCurrent,local_438,(ulong)(uint)(int)*psVar13);
      }
      else {
        pp_Stack_4a8 = _Precision;
        TempBuffer[0] = (undefined1)ap[0].gp_offset;
        TempBuffer[1] = ap[0].gp_offset._1_1_;
        TempBuffer[2] = ap[0].gp_offset._2_1_;
        TempBuffer[3] = ap[0].gp_offset._3_1_;
        stack0xfffffffffffffb64 = ap[0].fp_offset;
        ap[0]._0_8_ = uVar17;
        iVar5 = vfprintf((FILE *)stream->bsdFilePtr,local_438,&pp_Stack_4a8);
        pthrCurrent = (CPalThread *)&Precision;
        PAL_printf_arg_remover((va_list *)pthrCurrent,local_45c,local_460,iVar4,uVar1);
        pIVar21 = (INT *)Fmt;
      }
      stream = _Type;
      pIVar20 = pIVar21;
      if (iVar5 == -1) {
        if (PAL_InitializeChakraCoreCalled == false) {
LAB_0011d085:
          abort();
        }
      }
      else {
        iVar18 = iVar18 + iVar5;
      }
    }
    goto LAB_0011c80c;
  }
  if (local_45c == -3) {
    if ((uint)Precision < 0x29) {
      _Precision = (_func_int **)CONCAT44(Width,Precision + 8);
    }
    else {
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
  }
  else if (local_45c == -2) {
    uVar15 = (ulong)_Precision & 0xffffffff;
    if (uVar15 < 0x29) {
      _Precision = (_func_int **)CONCAT44(Width,Precision + 8);
      piVar14 = (int *)(uVar15 + (long)ap[0].overflow_arg_area);
    }
    else {
      piVar14 = (int *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    local_45c = *piVar14;
  }
  if (local_460 == 0xfffffffc) {
    if ((uint)Precision < 0x29) {
      _Precision = (_func_int **)CONCAT44(Width,Precision + 8);
    }
    else {
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
  }
  else if (local_460 == 0xfffffffe) {
    uVar15 = (ulong)_Precision & 0xffffffff;
    if (uVar15 < 0x29) {
      _Precision = (_func_int **)CONCAT44(Width,Precision + 8);
      puVar9 = (uint *)(uVar15 + (long)ap[0].overflow_arg_area);
    }
    else {
      puVar9 = (uint *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    local_460 = *puVar9;
  }
  uVar15 = (ulong)_Precision & 0xffffffff;
  if (uVar15 < 0x29) {
    _Precision = (_func_int **)CONCAT44(Width,Precision + 8);
    puVar11 = (undefined8 *)(uVar15 + (long)ap[0].overflow_arg_area);
  }
  else {
    puVar11 = (undefined8 *)ap[0]._0_8_;
    ap[0]._0_8_ = ap[0]._0_8_ + 8;
  }
  lpWideCharStr = (LPCWSTR)*puVar11;
  Prefix = iVar18;
  iVar18 = WideCharToMultiByte(0,0,lpWideCharStr,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
  if (iVar18 == 0) {
    fprintf((FILE *)_stderr,"] %s %s:%d","CoreVfprintf",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
            ,0x8fb);
    pCVar16 = _stderr;
    DVar6 = GetLastError();
    fprintf((FILE *)pCVar16,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar6);
  }
  else {
    pCVar16 = (CPalThread *)(long)iVar18;
    pthrCurrent = (CPalThread *)CorUnix::InternalMalloc((size_t)pCVar16);
    uVar1 = local_460;
    if (pthrCurrent == (CPalThread *)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011d085;
      piVar14 = __errno_location();
      *piVar14 = 8;
    }
    else {
      pCVar7 = pthrCurrent;
      uVar19 = 0;
      if (local_460 == 0xfffffffd) {
LAB_0011cb6d:
        *(CHAR *)&pCVar7->_vptr_CPalThread = '\0';
LAB_0011cb98:
        stream = _Type;
        IVar3 = Internal_AddPaddingVfprintf
                          (pCVar16,_Type,(LPSTR)pthrCurrent,local_45c - uVar19,local_474);
        if (IVar3 != -1) {
          iVar18 = Prefix + IVar3;
          CorUnix::InternalFree(pthrCurrent);
          pIVar20 = (INT *)Fmt;
          goto LAB_0011c80c;
        }
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011d085;
      }
      else {
        uVar19 = iVar18 - 1;
        if (((int)local_460 < 1) || ((int)uVar19 <= (int)local_460)) {
          pCVar16 = (CPalThread *)0x0;
          iVar18 = WideCharToMultiByte(0,0,lpWideCharStr,-1,(LPSTR)pthrCurrent,iVar18,(LPCSTR)0x0,
                                       (LPBOOL)0x0);
          if (iVar18 != 0) goto LAB_0011cb98;
          uVar17 = 0x928;
        }
        else {
          pCVar16 = (CPalThread *)0x0;
          iVar18 = WideCharToMultiByte(0,0,lpWideCharStr,local_460,(LPSTR)pthrCurrent,iVar18,
                                       (LPCSTR)0x0,(LPBOOL)0x0);
          if (iVar18 != 0) {
            pCVar7 = (CPalThread *)((long)&pthrCurrent->_vptr_CPalThread + (long)iVar18);
            uVar19 = uVar1;
            goto LAB_0011cb6d;
          }
          uVar17 = 0x917;
        }
        fprintf((FILE *)_stderr,"] %s %s:%d","CoreVfprintf",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                ,uVar17);
        pCVar16 = _stderr;
        DVar6 = GetLastError();
        fprintf((FILE *)pCVar16,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar6);
      }
      CorUnix::InternalFree(pthrCurrent);
    }
  }
LAB_0011d176:
  iVar18 = -1;
  goto LAB_0011d17c;
}

Assistant:

int CoreVfprintf(CPalThread *pthrCurrent, PAL_FILE *stream, const char *format, va_list aparg)
{
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    LPCSTR Fmt = format;
    LPWSTR TempWStr;
    LPSTR TempStr;
    WCHAR TempWChar;
    INT Flags;
    INT Width;
    INT Precision;
    INT Prefix;
    INT Type;
    INT Length;
    INT TempInt;
    int wctombResult;
    int written = 0;
    int paddingReturnValue;
    va_list ap;

    PERF_ENTRY(vfprintf);

    va_copy(ap, aparg);

    while (*Fmt)
    {
        if (*Fmt == '%' &&
            TRUE == Internal_ExtractFormatA(pthrCurrent, &Fmt, TempBuff, &Flags,
                                            &Width, &Precision,
                                            &Prefix, &Type))
        {
            if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_STRING)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                else if (WIDTH_INVALID == Width)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }
                else if (PRECISION_INVALID == Precision)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWStr = va_arg(ap, LPWSTR);
                Length = WideCharToMultiByte(CP_ACP, 0, TempWStr, -1, 0,
                                             0, 0, 0);
                if (!Length)
                {
                    ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                        GetLastError());
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                TempStr = (LPSTR) InternalMalloc(Length);
                if (!TempStr)
                {
                    ERROR("InternalMalloc failed\n");
                    pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                if (PRECISION_DOT == Precision)
                {
                    /* copy nothing */
                    *TempStr = 0;
                    Length = 0;
                }
                else if (Precision > 0 && Precision < Length - 1)
                {
                    Length = WideCharToMultiByte(CP_ACP, 0, TempWStr,
                                                 Precision, TempStr, Length,
                                                 0, 0);
                    if (!Length)
                    {
                        ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                              GetLastError());
                        InternalFree(TempStr);
                        PERF_EXIT(vfprintf);
                        va_end(ap);
                        return -1;
                    }
                    TempStr[Length] = 0;
                    Length = Precision;
                }
                /* copy everything */
                else
                {
                    wctombResult = WideCharToMultiByte(CP_ACP, 0, TempWStr, -1,
                                                       TempStr, Length, 0, 0);
                    if (!wctombResult)
                    {
                        ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                              GetLastError());
                        InternalFree(TempStr);
                        PERF_EXIT(vfprintf);
                        va_end(ap);
                        return -1;
                    }
                    --Length; /* exclude null char */
                }

                /* do the padding (if needed)*/
                paddingReturnValue =
                  Internal_AddPaddingVfprintf(pthrCurrent, stream, TempStr,
                                              Width - Length, Flags);
                if (-1 == paddingReturnValue)
                {
                    ERROR("Internal_AddPaddingVfprintf failed\n");
                    InternalFree(TempStr);
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                written += paddingReturnValue;

                InternalFree(TempStr);
            }
            else if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_CHAR)
            {
                CHAR TempBuffer[5];
                if (WIDTH_STAR == Width ||
                    WIDTH_INVALID == Width)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }
                if (PRECISION_STAR == Precision ||
                    PRECISION_INVALID == Precision)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWChar = va_arg(ap, int);
                Length = WideCharToMultiByte(CP_ACP, 0, &TempWChar, 1,
                                             TempBuffer, sizeof(TempBuffer),
                                             0, 0);
                if (!Length)
                {
                    ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                          GetLastError());
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                TempBuffer[Length] = 0;

                /* do the padding (if needed)*/
                paddingReturnValue =
                  Internal_AddPaddingVfprintf(pthrCurrent, stream, TempBuffer,
                                              Width - Length, Flags);
                if (-1 == paddingReturnValue)
                {
                    ERROR("Internal_AddPaddingVfprintf failed\n");
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                written += paddingReturnValue;

            }
            /* this places the number of bytes written to the buffer in the
               next arg */
            else if (Type == PFF_TYPE_N)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }

                if (Prefix == PFF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = written;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = written;
                }
            }
            else if (Type == PFF_TYPE_CHAR && (Flags & PFF_ZERO) != 0)
            {
                // Some versions of fprintf don't support 0-padded chars,
                // so we handle them here.
                char ch[2];

                ch[0] = (char) va_arg(ap, int);
                ch[1] = '\0';
                Length = 1;
                paddingReturnValue = Internal_AddPaddingVfprintf(
                                                pthrCurrent,
                                                stream,
                                                ch,
                                                Width - Length,
                                                Flags);
                if (-1 == paddingReturnValue)
                {
                    ERROR("Internal_AddPaddingVfprintf failed\n");
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                written += paddingReturnValue;
            }
            else if (Type == PFF_TYPE_STRING && (Flags & PFF_ZERO) != 0)
            {
                // Some versions of fprintf don't support 0-padded strings,
                // so we handle them here.
                char *tempStr;

                tempStr = va_arg(ap, char *);
                Length = strlen(tempStr);
                paddingReturnValue = Internal_AddPaddingVfprintf(
                                                pthrCurrent,
                                                stream,
                                                tempStr,
                                                Width - Length,
                                                Flags);
                if (-1 == paddingReturnValue)
                {
                    ERROR("Internal_AddPaddingVfprintf failed\n");
                    PERF_EXIT(vfprintf);
                    va_end(ap);
                    return -1;
                }
                written += paddingReturnValue;
            }
            else
            {
                // Types that fprintf can handle.
                TempInt = 0;

                // %h (short) doesn't seem to be handled properly by local sprintf,
                // so we do the truncation ourselves for some cases.
                if (Type == PFF_TYPE_P && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert from pointer -> int -> short to avoid warnings.
                    long trunc1;
                    short trunc2;

                    trunc1 = va_arg(ap, LONG);
                    trunc2 = (short)trunc1;
                    trunc1 = trunc2;

                    TempInt = fprintf(stream->bsdFilePtr, TempBuff, trunc1);
                }
                else if (Type == PFF_TYPE_INT && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert explicitly from int to short to get
                    // correct sign extension for shorts on all systems.
                    int n;
                    short s;

                    n = va_arg(ap, int);
                    s = (short) n;

                    TempInt = fprintf( stream->bsdFilePtr, TempBuff, s);
                }
                else
                {
                    va_list apcopy;
                    va_copy(apcopy, ap);
                    TempInt = vfprintf(stream->bsdFilePtr, TempBuff, apcopy);
                    va_end(apcopy);
                    PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);
                }

                if (-1 == TempInt)
                {
                    ERROR("vfprintf returned an error\n");
                }
                else
                {
                    written += TempInt;
                }
            }
        }
        else
        {

#if FILE_OPS_CHECK_FERROR_OF_PREVIOUS_CALL
            clearerr (stream->bsdFilePtr);
#endif

            InternalFwrite(Fmt++, 1, 1, stream->bsdFilePtr, &stream->PALferrorCode); /* copy regular chars into buffer */
            if (stream->PALferrorCode == PAL_FILE_ERROR)
            {
                ERROR("fwrite() failed with errno == %d\n", errno);
                PERF_EXIT(vfprintf);
                va_end(ap);
                return -1;
            }
            ++written;
        }
    }

    va_end(ap);

    PERF_EXIT(vfprintf);
    return written;
}